

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexBuffer
          (OgreBinarySerializer *this,VertexData *dest)

{
  uint32_t uVar1;
  DeadlyImportError *pDVar2;
  uint8_t *numBytes_00;
  MemoryIOStream *this_00;
  mapped_type *this_01;
  Logger *this_02;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *this_03;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_c0;
  shared_ptr<Assimp::MemoryIOStream> local_a0;
  uint8_t *local_90;
  uint8_t *vertexBuffer;
  size_t numBytes;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  uint16_t local_1e;
  uint16_t local_1c;
  uint16_t local_1a;
  uint16_t id;
  uint16_t vertexSize;
  VertexData *pVStack_18;
  uint16_t bindIndex;
  VertexData *dest_local;
  OgreBinarySerializer *this_local;
  
  pVStack_18 = dest;
  dest_local = (VertexData *)this;
  local_1a = Read<unsigned_short>(this);
  local_1c = Read<unsigned_short>(this);
  local_1e = ReadHeader(this,true);
  if (local_1e != 0x5210) {
    local_55 = 1;
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "M_GEOMETRY_VERTEX_BUFFER_DATA not found in M_GEOMETRY_VERTEX_BUFFER",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar2,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  uVar1 = VertexData::VertexSize(pVStack_18,local_1a);
  if (uVar1 != local_1c) {
    numBytes._6_1_ = 1;
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "Vertex buffer size does not agree with vertex declaration in M_GEOMETRY_VERTEX_BUFFER"
               ,(allocator<char> *)((long)&numBytes + 7));
    DeadlyImportError::DeadlyImportError(pDVar2,&local_78);
    numBytes._6_1_ = 0;
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  numBytes_00 = (uint8_t *)(ulong)((pVStack_18->super_IVertexData).count * (uint)local_1c);
  vertexBuffer = numBytes_00;
  local_90 = ReadBytes(this,(size_t)numBytes_00);
  this_00 = (MemoryIOStream *)
            Intern::AllocateFromAssimpHeap::operator_new
                      ((AllocateFromAssimpHeap *)0x28,(size_t)numBytes_00);
  MemoryIOStream::MemoryIOStream(this_00,local_90,(size_t)vertexBuffer,true);
  std::shared_ptr<Assimp::MemoryIOStream>::shared_ptr<Assimp::MemoryIOStream,void>
            (&local_a0,this_00);
  this_01 = std::
            map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
            ::operator[](&pVStack_18->vertexBindings,&local_1a);
  std::shared_ptr<Assimp::MemoryIOStream>::operator=(this_01,&local_a0);
  std::shared_ptr<Assimp::MemoryIOStream>::~shared_ptr(&local_a0);
  this_02 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[37]>(&local_238,(char (*) [37])"    - Read vertex buffer for source ");
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_238,&local_1a);
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar3,(char (*) [5])0xc82220);
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar3,(unsigned_long *)&vertexBuffer);
  this_03 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar3,(char (*) [7])" bytes");
  Formatter::basic_formatter::operator_cast_to_string(&local_c0,this_03);
  Logger::debug(this_02,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_238);
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexBuffer(VertexData *dest)
{
    uint16_t bindIndex = Read<uint16_t>();
    uint16_t vertexSize = Read<uint16_t>();

    uint16_t id = ReadHeader();
    if (id != M_GEOMETRY_VERTEX_BUFFER_DATA)
        throw DeadlyImportError("M_GEOMETRY_VERTEX_BUFFER_DATA not found in M_GEOMETRY_VERTEX_BUFFER");

    if (dest->VertexSize(bindIndex) != vertexSize)
        throw DeadlyImportError("Vertex buffer size does not agree with vertex declaration in M_GEOMETRY_VERTEX_BUFFER");

    size_t numBytes = dest->count * vertexSize;
    uint8_t *vertexBuffer = ReadBytes(numBytes);
    dest->vertexBindings[bindIndex] = MemoryStreamPtr(new Assimp::MemoryIOStream(vertexBuffer, numBytes, true));

    ASSIMP_LOG_DEBUG_F( "    - Read vertex buffer for source ", bindIndex, " of ", numBytes, " bytes");
}